

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackComponentGroup.h
# Opt level: O1

void __thiscall cmCPackComponent::cmCPackComponent(cmCPackComponent *this,cmCPackComponent *param_1)

{
  pointer pcVar1;
  
  (this->Name)._M_dataplus._M_p = (pointer)&(this->Name).field_2;
  pcVar1 = (param_1->Name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)this,pcVar1,pcVar1 + (param_1->Name)._M_string_length);
  (this->DisplayName)._M_dataplus._M_p = (pointer)&(this->DisplayName).field_2;
  pcVar1 = (param_1->DisplayName)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->DisplayName,pcVar1,pcVar1 + (param_1->DisplayName)._M_string_length);
  this->field_0x48 = param_1->field_0x48;
  this->Group = param_1->Group;
  (this->Description)._M_dataplus._M_p = (pointer)&(this->Description).field_2;
  pcVar1 = (param_1->Description)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->Description,pcVar1,pcVar1 + (param_1->Description)._M_string_length);
  std::vector<cmCPackInstallationType_*,_std::allocator<cmCPackInstallationType_*>_>::vector
            (&this->InstallationTypes,&param_1->InstallationTypes);
  (this->ArchiveFile)._M_dataplus._M_p = (pointer)&(this->ArchiveFile).field_2;
  pcVar1 = (param_1->ArchiveFile)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->ArchiveFile,pcVar1,pcVar1 + (param_1->ArchiveFile)._M_string_length);
  (this->Plist)._M_dataplus._M_p = (pointer)&(this->Plist).field_2;
  pcVar1 = (param_1->Plist)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->Plist,pcVar1,pcVar1 + (param_1->Plist)._M_string_length);
  std::vector<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>::vector
            (&this->Dependencies,&param_1->Dependencies);
  std::vector<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>::vector
            (&this->ReverseDependencies,&param_1->ReverseDependencies);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->Files,&param_1->Files);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->Directories,&param_1->Directories);
  this->TotalSize = param_1->TotalSize;
  return;
}

Assistant:

cmCPackComponent()
    : IsRequired(true)
    , IsHidden(false)
    , IsDisabledByDefault(false)
    , IsDownloaded(false)
  {
  }